

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry *
NscBuildStatement(CNscPStackEntry *pList,CNscPStackEntry *pStatement,CNscPStackEntry *pFence)

{
  NscType nType;
  int nLocals;
  NscType nType_00;
  
  if (pList == (CNscPStackEntry *)0x0) {
    pList = CNscContext::GetPStackEntryInt(g_pCtx);
  }
  if ((g_pCtx->m_fPhase2 != false) || (g_pCtx->m_fNWScript == true)) {
    nType_00 = NscType_Error;
    if (pList->m_nType == NscType_Error) goto LAB_0015de79;
    if (pStatement != (CNscPStackEntry *)0x0) {
      nType = pStatement->m_nType;
      if (nType == NscType_Error) goto LAB_0015de79;
      if (pFence == (CNscPStackEntry *)0x0) {
        nLocals = 0;
      }
      else {
        nLocals = g_pCtx->m_pCurrentFence->nLocals;
      }
      if (nType != NscType_Unknown) {
        CNscPStackEntry::PushSimpleOp(pStatement,NscPCode_ExpressionEnd,nType);
      }
      if (pFence == (CNscPStackEntry *)0x0) {
        CNscPStackEntry::AppendData(pList,pStatement);
      }
      else {
        CNscPStackEntry::PushStatement
                  (pList,nLocals,pStatement->m_pauchData,pStatement->m_nDataSize);
      }
    }
  }
  nType_00 = NscType_Unknown;
LAB_0015de79:
  if (pList->m_nType == NscType_Unknown) {
    CNscPStackEntry::SetType(pList,nType_00);
  }
  if (pFence != (CNscPStackEntry *)0x0) {
    CNscContext::RestoreFence(g_pCtx,pFence);
    CNwnDoubleLinkList::InsertAfter(&pFence->m_link,&g_pCtx->m_listEntryFree);
  }
  if (pStatement != (CNscPStackEntry *)0x0) {
    CNwnDoubleLinkList::InsertAfter(&pStatement->m_link,&g_pCtx->m_listEntryFree);
  }
  return pList;
}

Assistant:

YYSTYPE NscBuildStatement (YYSTYPE pList, YYSTYPE pStatement, YYSTYPE pFence)
{

	//
	// If there isn't an list, then create
	//

	CNscPStackEntry *pOut = pList;
	if (pOut == NULL)
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);


	//
	// If this is phase1 and we are in a function, do nothing
	//

	NscType nOutType;
	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		nOutType = NscType_Unknown;
	}
	
	//
	// Check for errors
	//

	else if (pOut ->GetType () == NscType_Error ||
		(pStatement != NULL && pStatement ->GetType () == NscType_Error))
	{
		nOutType = NscType_Error;
	}

	//
	// Otherwise, we are good
	//

	else
	{

		//
		// Set the return type
		//

		nOutType = NscType_Unknown;

		//
		// If we have a statement 
		//

		if (pStatement != NULL)
		{

			//
			// Compute the size of the locals from the fence
			//

			int nLocals = 0;
			if (pFence)
			{
				NscSymbolFence *pFence = g_pCtx ->GetCurrentFence ();
				nLocals = pFence ->nLocals;
			}

			//
			// If the statement has a type, then add an end expression
			//

			if (pStatement ->GetType () != NscType_Unknown)
			{
				pStatement ->PushSimpleOp (NscPCode_ExpressionEnd, 
					pStatement ->GetType ());
			}

			//
			// If we have a fence, then push the whole block as a
			// statement.  Otherwise, just append as one more in
			// a series of statements.
			//

			if (pFence != NULL)
			{
				pOut ->PushStatement (
					nLocals,
					pStatement ->GetData (), 
					pStatement ->GetDataSize ());
			}

			//
			// Otherwise, we just do a simple append
			//

			else
			{
				pOut ->AppendData (pStatement);
			}
		}
	}

	//
	// Set the new type
	//

	if (pOut ->GetType () == NscType_Unknown)
		pOut ->SetType (nOutType);

	//
	// Process the fence
	//

	if (pFence != NULL)
	{
		g_pCtx ->RestoreFence (pFence);
		g_pCtx ->FreePStackEntry (pFence);
	}

	//
	// Return the new argument list
	//

	if (pStatement)
        g_pCtx ->FreePStackEntry (pStatement);
	return pOut;
}